

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::processScheme(XMLCh *schemeStr,XMLSize_t *index)

{
  bool bVar1;
  XMLCh *pXVar2;
  XMLSize_t schemeLen;
  
  pXVar2 = XMLString::findAny(schemeStr,(XMLCh *)SCHEME_SEPARATORS);
  if (pXVar2 != (XMLCh *)0x0) {
    schemeLen = (long)pXVar2 - (long)schemeStr >> 1;
    *index = schemeLen;
    bVar1 = isConformantSchemeName(schemeStr,schemeLen);
    return bVar1;
  }
  return false;
}

Assistant:

bool XMLUri::processScheme(const XMLCh* const schemeStr, XMLSize_t& index)
{
    const XMLCh* tmpPtr = XMLString::findAny(schemeStr, SCHEME_SEPARATORS);

    if (tmpPtr) {
        index = tmpPtr - schemeStr;
        return isConformantSchemeName(schemeStr, index);
    }
    else {
        return false;
    }
}